

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O2

void event_go_to_exercise_time(tgestate_t *state)

{
  state->bell = '(';
  queue_message(state,message_EXERCISE_TIME);
  state->locked_doors[0] = '\0';
  state->locked_doors[1] = '\x01';
  set_hero_route(state,(route_t *)&set_route_go_to_yard_t14);
  set_prisoners_and_guards_route_B(state,(route_t *)&set_route_go_to_yard_t14);
  return;
}

Assistant:

static void event_go_to_exercise_time(tgestate_t *state)
{
  assert(state != NULL);

  state->bell = bell_RING_40_TIMES;
  queue_message(state, message_EXERCISE_TIME);

  /* Unlock the gates. */
  state->locked_doors[0] = 0; /* Index into doors + clear locked flag. */
  state->locked_doors[1] = 1;

  set_route_go_to_yard(state);
}